

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_law_compression.cc
# Opt level: O2

bool __thiscall sptk::MuLawCompression::Run(MuLawCompression *this,double input,double *output)

{
  double dVar1;
  int iVar2;
  bool bVar3;
  double dVar4;
  
  bVar3 = (bool)(output != (double *)0x0 & this->is_valid_);
  if (bVar3 == true) {
    dVar4 = this->abs_max_value_;
    dVar1 = this->constant_;
    iVar2 = ExtractSign(input);
    dVar4 = log1p((ABS(input) / dVar4) * this->compression_factor_);
    *output = dVar4 * (double)iVar2 * dVar1;
  }
  return bVar3;
}

Assistant:

bool MuLawCompression::Run(double input, double* output) const {
  if (!is_valid_ || NULL == output) {
    return false;
  }

  const double x(std::fabs(input) / abs_max_value_);
  *output = (constant_ * sptk::ExtractSign(input) *
             std::log1p(compression_factor_ * x));

  return true;
}